

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

void __thiscall
lodepng::ExtractZlib::inflateNoCompression
          (ExtractZlib *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,
          size_t *bp,size_t *pos,size_t inlength)

{
  ulong uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  value_type_conflict1 *__x;
  ulong *in_RCX;
  long in_RDX;
  long in_RDI;
  long *in_R8;
  ulong in_R9;
  unsigned_long n;
  unsigned_long NLEN;
  unsigned_long LEN;
  size_t p;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_50;
  long local_38;
  
  while ((*in_RCX & 7) != 0) {
    *in_RCX = *in_RCX + 1;
  }
  uVar1 = *in_RCX >> 3;
  if (uVar1 < in_R9 - 4) {
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              (ulong)((uint)*(byte *)(in_RDX + uVar1) + (uint)*(byte *)(in_RDX + 1 + uVar1) * 0x100)
    ;
    __x = (value_type_conflict1 *)
          (ulong)((uint)*(byte *)(in_RDX + 2 + uVar1) + (uint)*(byte *)(in_RDX + 3 + uVar1) * 0x100)
    ;
    local_38 = uVar1 + 4;
    if (__x + (long)&this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> ==
        (value_type_conflict1 *)0xffff) {
      if (in_R9 < (ulong)((long)&(this_00->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start + local_38)) {
        *(undefined4 *)(in_RDI + 8) = 0x17;
      }
      else {
        for (local_50 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
            local_50 < this_00;
            local_50 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ((long)&(local_50->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1)) {
          local_38 = local_38 + 1;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(this_00,__x);
          *in_R8 = *in_R8 + 1;
        }
        *in_RCX = local_38 << 3;
      }
    }
    else {
      *(undefined4 *)(in_RDI + 8) = 0x15;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 8) = 0x34;
  }
  return;
}

Assistant:

void inflateNoCompression(std::vector<unsigned char>& out,
                            const unsigned char* in, size_t& bp, size_t& pos, size_t inlength) {
    while((bp & 0x7) != 0) bp++; //go to first boundary of byte
    size_t p = bp / 8;
    if(p >= inlength - 4) { error = 52; return; } //error, bit pointer will jump past memory
    unsigned long LEN = in[p] + 256u * in[p + 1], NLEN = in[p + 2] + 256u * in[p + 3]; p += 4;
    if(LEN + NLEN != 65535) { error = 21; return; } //error: NLEN is not one's complement of LEN
    if(p + LEN > inlength) { error = 23; return; } //error: reading outside of in buffer
    for(unsigned long n = 0; n < LEN; n++) {
      out.push_back(in[p++]); //read LEN bytes of literal data
      pos++;
    }
    bp = p * 8;
  }